

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
          (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,qsizetype i)

{
  char *in_RSI;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RDI;
  
  remove(in_RDI,in_RSI);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }